

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O0

void __thiscall
imrt::EvaluationFunction::update_sorted_voxels
          (EvaluationFunction *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int o,int k)

{
  double dVar1;
  double dVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar7;
  key_type *in_stack_ffffffffffffff18;
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  *in_stack_ffffffffffffff20;
  value_type *in_stack_ffffffffffffff38;
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  *in_stack_ffffffffffffff40;
  
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)(in_RDI + 0x150),(long)in_R8D);
  std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
  std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff18,(int *)0x120d4e);
  std::make_pair<double&,std::pair<int,int>>
            ((double *)in_stack_ffffffffffffff20,(pair<int,_int> *)in_stack_ffffffffffffff18);
  std::
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::erase(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)in_R8D);
  if (*pvVar5 <= 0.0) {
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x10),(long)in_R8D);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
    dVar7 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)in_R8D);
    if (dVar7 < *pvVar5 || dVar7 == *pvVar5) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x150),(long)in_R8D);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
      *pvVar5 = 0.0;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_R8D);
      in_stack_ffffffffffffff38 = (value_type *)*pvVar5;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)in_R8D);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
      dVar7 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RCX,(long)in_R8D);
      in_stack_ffffffffffffff40 =
           (set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
            *)((double)in_stack_ffffffffffffff38 * (dVar7 - *pvVar5));
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)in_R8D);
      dVar7 = (double)in_stack_ffffffffffffff40 / (double)*pvVar6;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x150),(long)in_R8D);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
      *pvVar5 = dVar7;
    }
  }
  else {
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x10),(long)in_R8D);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
    dVar7 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)in_R8D);
    if (*pvVar5 <= dVar7) {
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x150),(long)in_R8D);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
      *pvVar5 = 0.0;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)in_R8D);
      dVar7 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x10),(long)in_R8D);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
      dVar1 = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)in_R8D);
      dVar2 = *pvVar5;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x50),(long)in_R8D);
      iVar3 = *pvVar6;
      pvVar4 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             *)(in_RDI + 0x150),(long)in_R8D);
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
      *pvVar5 = (dVar7 * (dVar1 - dVar2)) / (double)iVar3;
    }
  }
  pvVar4 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *)(in_RDI + 0x150),(long)in_R8D);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
  if ((*pvVar5 != 0.0) || (NAN(*pvVar5))) {
    pvVar4 = std::
             vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)(in_RDI + 0x150),(long)in_R8D);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)in_R9D);
    std::make_pair<int&,int&>((int *)in_stack_ffffffffffffff18,(int *)0x12110c);
    std::make_pair<double&,std::pair<int,int>>(pvVar5,(pair<int,_int> *)in_stack_ffffffffffffff18);
    std::
    set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ::insert(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return;
}

Assistant:

void EvaluationFunction::update_sorted_voxels(vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, int o, int k){
		voxels.erase(make_pair(D[o][k],make_pair(o,k)));

		if(Zmin[o]>0){
			 if(Z[o][k] < Zmin[o])  D[o][k]=w[o]*(Z[o][k]-Zmin[o])/nb_voxels[o];
			 else D[o][k]=0.0;
		}else{
			if(Z[o][k] > Zmax[o]) D[o][k]=w[o]*(Z[o][k]-Zmax[o])/nb_voxels[o];
			else D[o][k]=0.0;
		}
		if(D[o][k]!=0.0)
			voxels.insert(make_pair(D[o][k],make_pair(o,k)));
}